

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superAnd.c
# Opt level: O2

void Super2_Precompute(int nInputs,int nLevels,int fVerbose)

{
  int iVar1;
  Extra_MmFixed_t *p;
  Super2_Lib_t *pSVar2;
  Super2_Gate_t **ppSVar3;
  Super2_Gate_t *pSVar4;
  Super2_Gate_t *pSVar5;
  Super2_Lib_t *pLib;
  stmm_table *table;
  abctime aVar6;
  abctime aVar7;
  FILE *__stream;
  char *pcVar8;
  uint uVar9;
  Super2_Gate_t *pSVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  char **local_f0;
  uint local_e4;
  Extra_MmFixed_t *local_e0;
  Super2_Gate_t *local_d8;
  uint local_cc;
  Super2_Gate_t *local_c8;
  Super2_Lib_t *local_c0;
  stmm_table *local_b8;
  ulong local_b0;
  uint local_a4;
  abctime local_a0;
  Super2_Gate_t *pGate2;
  
  local_e4 = nLevels;
  if (5 < nInputs) {
    __assert_fail("nInputs < 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/super/superAnd.c"
                  ,0x78,"void Super2_Precompute(int, int, int)");
  }
  p = Extra_MmFixedStart(0x20);
  local_b8 = stmm_init_table(st__ptrcmp,st__ptrhash);
  pSVar2 = Super2_LibStart();
  pSVar2->nInputs = nInputs;
  uVar18 = 1 << ((byte)nInputs & 0x1f);
  pSVar2->nMints = uVar18;
  pSVar2->nLevels = 0;
  pSVar2->nGates = nInputs + 1;
  uVar19 = 1;
  pSVar2->nGatesAlloc = nInputs + 1;
  pSVar2->uMaskBit = 1 << ((char)uVar18 - 1U & 0x1f);
  ppSVar3 = (Super2_Gate_t **)malloc((long)nInputs * 8 + 8);
  pSVar2->pGates = ppSVar3;
  local_e0 = p;
  local_c0 = pSVar2;
  pSVar4 = (Super2_Gate_t *)Extra_MmFixedEntryFetch(p);
  *ppSVar3 = pSVar4;
  *(undefined8 *)pSVar4 = 0;
  pSVar4->pOne = (Super2_Gate_t *)0x0;
  pSVar4->pTwo = (Super2_Gate_t *)0x0;
  pSVar4->pNext = (Super2_Gate_t *)0x0;
  pSVar10 = (Super2_Gate_t *)0x0;
  pSVar4 = (Super2_Gate_t *)0x0;
  if (0 < nInputs) {
    pSVar4 = (Super2_Gate_t *)(ulong)(uint)nInputs;
  }
  for (; table = local_b8, uVar11 = local_e4, pSVar4 != pSVar10;
      pSVar10 = (Super2_Gate_t *)((long)&pSVar10->uTruth + 1)) {
    pSVar5 = (Super2_Gate_t *)Extra_MmFixedEntryFetch(local_e0);
    ppSVar3[(long)((long)&pSVar10->uTruth + 1)] = pSVar5;
    *(undefined8 *)pSVar5 = 0;
    pSVar5->pOne = (Super2_Gate_t *)0x0;
    pSVar5->pTwo = (Super2_Gate_t *)0x0;
    pSVar5->pNext = (Super2_Gate_t *)0x0;
    ppSVar3[(long)((long)&pSVar10->uTruth + 1)]->pTwo = pSVar10;
  }
  for (uVar9 = 0; uVar9 != uVar18; uVar9 = uVar9 + 1) {
    for (pSVar10 = (Super2_Gate_t *)0x0; pSVar4 != pSVar10;
        pSVar10 = (Super2_Gate_t *)((long)&pSVar10->uTruth + 1)) {
      if ((uVar9 >> ((uint)pSVar10 & 0x1f) & 1) != 0) {
        ppSVar3[(long)((long)&pSVar10->uTruth + 1)]->uTruth =
             ppSVar3[(long)((long)&pSVar10->uTruth + 1)]->uTruth | 1 << ((byte)uVar9 & 0x1f);
      }
    }
  }
  printf("Computing supergates for %d inputs and %d levels:\n",(ulong)(uint)nInputs,(ulong)local_e4)
  ;
  if ((int)uVar11 < 1) {
    uVar11 = 0;
  }
  local_e4 = uVar11 + 1;
  pSVar2 = local_c0;
  do {
    if (uVar19 == local_e4) {
      puts("Writing the output file...");
      fflush(_stdout);
      if (pSVar2->nLevels < 6) {
        aVar6 = Abc_Clock();
        s_uMaskBit = pSVar2->uMaskBit;
        s_uMaskAll = 0xffffffff >> (-(char)pSVar2->nMints & 0x1fU);
        iVar12 = 0;
        qsort(pSVar2->pGates,(long)pSVar2->nGates,8,Super2_LibCompareGates);
        ppSVar3 = pSVar2->pGates;
        iVar1 = Super2_LibCompareGates(ppSVar3,ppSVar3 + (long)pSVar2->nGates + -1);
        iVar14 = (int)ppSVar3;
        if (-1 < iVar1) {
          __assert_fail("Super2_LibCompareGates( pLib->pGates, pLib->pGates + pLib->nGates - 1 ) < 0"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/super/superAnd.c"
                        ,0x1e0,"void Super2_LibWrite(Super2_Lib_t *)");
        }
        Abc_Print(iVar14,"%s =","Sorting");
        aVar7 = Abc_Clock();
        Abc_Print(iVar14,"%9.2f sec\n",(double)(aVar7 - aVar6) / 1000000.0);
        sprintf((char *)&pGate2,"superI%dL%d",(ulong)(uint)pSVar2->nInputs,
                (ulong)(uint)pSVar2->nLevels);
        __stream = fopen((char *)&pGate2,"w");
        pcVar8 = Extra_TimeStamp();
        fprintf(__stream,"# AND2/INV supergates derived on %s.\n",pcVar8);
        fprintf(__stream,"# Command line: \"super2 -i %d -l %d\".\n",(ulong)(uint)pSVar2->nInputs,
                (ulong)(uint)pSVar2->nLevels);
        fprintf(__stream,"# The number of inputs     = %6d.\n",(ulong)(uint)pSVar2->nInputs);
        fprintf(__stream,"# The number of levels     = %6d.\n",(ulong)(uint)pSVar2->nLevels);
        fprintf(__stream,"# The number of supergates = %6d.\n",(ulong)(uint)pSVar2->nGates);
        fprintf(__stream,"# The total functions      = %6d.\n",
                (ulong)(uint)(1 << ((char)pSVar2->nMints - 1U & 0x1f)));
        fputc(10,__stream);
        fprintf(__stream,"%6d\n",(ulong)(uint)pSVar2->nGates);
        while ((pSVar2->i = iVar12, iVar12 < pSVar2->nGates &&
               (pSVar2->pGates[iVar12] != (Super2_Gate_t *)0x0))) {
          Super2_LibWriteGate((FILE *)__stream,pSVar2,pSVar2->pGates[iVar12]);
          iVar12 = pSVar2->i + 1;
        }
        fclose(__stream);
        printf("The supergates are written into file \"%s\" ",&pGate2);
        iVar1 = Extra_FileSize((char *)&pGate2);
        printf("(%0.2f MB).\n",(double)iVar1 * 9.5367431640625e-07);
      }
      else {
        printf("Cannot write file for %d levels.\n");
      }
      Super2_LibStop(pSVar2);
      Extra_MmFixedStop(local_e0);
      stmm_free_table(table);
      return;
    }
    local_a4 = uVar19;
    local_a0 = Abc_Clock();
    pLib = Super2_LibStart();
    iVar1 = pSVar2->nMints;
    iVar12 = pSVar2->nLevels;
    iVar14 = pSVar2->nGates;
    local_cc = 0xffffffff >> (-(char)pSVar2->nMints & 0x1fU);
    uVar19 = pSVar2->nGates;
    pLib->nInputs = pSVar2->nInputs;
    pLib->nMints = iVar1;
    pLib->nLevels = iVar12;
    pLib->nGates = iVar14;
    local_c8 = (Super2_Gate_t *)CONCAT44(local_c8._4_4_,pSVar2->uMaskBit);
    pLib->uMaskBit = pSVar2->uMaskBit;
    iVar1 = pSVar2->nGatesAlloc;
    pLib->nGatesAlloc = iVar1 + 1000;
    local_d8 = (Super2_Gate_t *)malloc((long)iVar1 * 8 + 8000);
    pLib->pGates = (Super2_Gate_t **)local_d8;
    local_c0 = pSVar2;
    memcpy(local_d8,pSVar2->pGates,(long)(int)uVar19 << 3);
    stmm_free_table(table);
    table = stmm_init_table(st__ptrcmp,st__ptrhash);
    uVar15 = 0;
    if (0 < (int)uVar19) {
      uVar15 = (ulong)uVar19;
    }
    local_b0 = (long)(int)uVar19;
    for (uVar17 = 0; uVar18 = local_cc, uVar15 != uVar17; uVar17 = uVar17 + 1) {
      pSVar4 = *(Super2_Gate_t **)(&local_d8->uTruth + uVar17 * 2);
      if (pSVar4 == (Super2_Gate_t *)0x0) {
        uVar15 = uVar17 & 0xffffffff;
        break;
      }
      uVar19 = pSVar4->uTruth;
      uVar18 = ~uVar19 & local_cc;
      if (((uint)local_c8 & uVar19) == 0) {
        uVar18 = uVar19;
      }
      iVar1 = stmm_lookup(table,(char *)(ulong)uVar18,(char **)&pGate2);
      if (iVar1 != 0) {
        pLib->i = (int)uVar17;
        puts("New gate:");
        Super2_LibWriteGate((FILE *)_stdout,pLib,pSVar4);
        puts("Gate in the table:");
        Super2_LibWriteGate((FILE *)_stdout,pLib,pGate2);
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/super/superAnd.c"
                      ,0x167,"Super2_Lib_t *Super2_LibCompute(Super2_Man_t *, Super2_Lib_t *)");
      }
      stmm_insert(table,(char *)(ulong)uVar18,(char *)pSVar4);
    }
    pLib->i = (int)uVar15;
    iVar1 = 0;
    pSVar2 = local_c0;
    local_b8 = table;
    while( true ) {
      uVar19 = local_a4;
      pSVar2->i = iVar1;
      if ((pSVar2->nGates <= iVar1) ||
         (local_d8 = pSVar2->pGates[iVar1], local_d8 == (Super2_Gate_t *)0x0)) break;
      if ((iVar1 != 0) && (iVar1 % 300 == 0)) {
        printf("Tried %5d first gates...\n");
        fflush(_stdout);
      }
      local_c8 = (Super2_Gate_t *)((ulong)local_d8 ^ 1);
      iVar1 = 0;
      while( true ) {
        pSVar2->k = iVar1;
        if (pSVar2->i <= iVar1) break;
        pGate2 = pSVar2->pGates[iVar1];
        if (pGate2 == (Super2_Gate_t *)0x0) break;
        uVar19 = local_d8->uTruth;
        uVar11 = pGate2->uTruth;
        uVar16 = uVar11 & uVar19;
        uVar9 = pLib->uMaskBit;
        uVar13 = ~uVar16 & uVar18;
        if ((uVar16 & uVar9) == 0) {
          uVar13 = uVar16;
        }
        iVar1 = stmm_find_or_add(table,(char *)(ulong)uVar13,&local_f0);
        if (iVar1 == 0) {
          pSVar4 = (Super2_Gate_t *)Extra_MmFixedEntryFetch(local_e0);
          pSVar4->pOne = local_d8;
          pSVar4->pTwo = pGate2;
          pSVar4->uTruth = uVar16;
          *local_f0 = (char *)pSVar4;
          Super2_LibAddGate(pLib,pSVar4);
          uVar9 = pLib->uMaskBit;
        }
        uVar16 = ~uVar19 & uVar18 & uVar11;
        uVar13 = uVar9 & uVar16;
        if ((uVar9 & uVar16) != 0) {
          uVar13 = uVar18;
        }
        iVar1 = stmm_find_or_add(local_b8,(char *)(ulong)(uVar13 ^ uVar16),&local_f0);
        if (iVar1 == 0) {
          pSVar4 = (Super2_Gate_t *)Extra_MmFixedEntryFetch(local_e0);
          pSVar4->pOne = local_c8;
          pSVar4->pTwo = pGate2;
          pSVar4->uTruth = uVar16;
          *local_f0 = (char *)pSVar4;
          Super2_LibAddGate(pLib,pSVar4);
          uVar9 = pLib->uMaskBit;
        }
        table = local_b8;
        uVar16 = uVar19 & uVar18 & ~uVar11;
        uVar13 = uVar9 & uVar16;
        if ((uVar9 & uVar16) != 0) {
          uVar13 = uVar18;
        }
        iVar1 = stmm_find_or_add(local_b8,(char *)(ulong)(uVar13 ^ uVar16),&local_f0);
        if (iVar1 == 0) {
          pSVar4 = (Super2_Gate_t *)Extra_MmFixedEntryFetch(local_e0);
          pSVar4->pOne = local_d8;
          pSVar4->pTwo = (Super2_Gate_t *)((ulong)pGate2 ^ 1);
          pSVar4->uTruth = uVar16;
          *local_f0 = (char *)pSVar4;
          Super2_LibAddGate(pLib,pSVar4);
          uVar9 = pLib->uMaskBit;
        }
        uVar11 = ~uVar19 & uVar18 & ~uVar11;
        uVar19 = uVar9 & uVar11;
        if ((uVar9 & uVar11) != 0) {
          uVar19 = uVar18;
        }
        iVar1 = stmm_find_or_add(table,(char *)(ulong)(uVar19 ^ uVar11),&local_f0);
        pSVar2 = local_c0;
        if (iVar1 == 0) {
          pSVar4 = (Super2_Gate_t *)Extra_MmFixedEntryFetch(local_e0);
          pSVar4->pOne = local_c8;
          pSVar4->pTwo = (Super2_Gate_t *)((ulong)pGate2 ^ 1);
          pSVar4->uTruth = uVar11;
          *local_f0 = (char *)pSVar4;
          Super2_LibAddGate(pLib,pSVar4);
        }
        local_b0 = (ulong)((int)local_b0 + 4);
        iVar1 = pSVar2->k + 1;
      }
      iVar1 = pSVar2->i + 1;
    }
    pLib->nLevels = local_a4;
    Super2_LibStop(pSVar2);
    iVar1 = 0x7acb98;
    printf("Level %d:  Tried = %7d.  Computed = %7d.  ",(ulong)uVar19,local_b0);
    Abc_Print(iVar1,"%s =","Runtime");
    aVar6 = Abc_Clock();
    Abc_Print(iVar1,"%9.2f sec\n",(double)(aVar6 - local_a0) / 1000000.0);
    fflush(_stdout);
    uVar19 = uVar19 + 1;
    pSVar2 = pLib;
  } while( true );
}

Assistant:

void Super2_Precompute( int nInputs, int nLevels, int fVerbose )
{
    Super2_Man_t * pMan;
    Super2_Lib_t * pLibCur, * pLibNext;
    int Level;
    abctime clk;

    assert( nInputs < 6 );

    // start the manager
    pMan = Super2_ManStart();

    // get the starting supergates
    pLibCur = Super2_LibFirst( pMan, nInputs );

    // perform the computation of supergates
printf( "Computing supergates for %d inputs and %d levels:\n", nInputs, nLevels );
    for ( Level = 1; Level <= nLevels; Level++ )
    {
clk = Abc_Clock();
        pLibNext = Super2_LibCompute( pMan, pLibCur );
        pLibNext->nLevels = Level;
        Super2_LibStop( pLibCur );
        pLibCur = pLibNext;
printf( "Level %d:  Tried = %7d.  Computed = %7d.  ", Level, pMan->nTried, pLibCur->nGates );
ABC_PRT( "Runtime", Abc_Clock() - clk );
fflush( stdout );
    }

printf( "Writing the output file...\n" );
fflush( stdout );
    // write them into a file
    Super2_LibWrite( pLibCur );
    Super2_LibStop( pLibCur );

    // stop the manager
    Super2_ManStop( pMan );
}